

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O0

void __thiscall WebServer::cachePage(WebServer *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  char *__end;
  mapped_type *this_00;
  allocator<char> local_131;
  string local_130 [32];
  char *local_110;
  char *file;
  void *mmapAddr;
  undefined4 local_f8;
  int fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string path;
  stat fileStat;
  string *filename_local;
  WebServer *this_local;
  
  std::operator+(&local_e8,&HttpConn::root_abi_cxx11_,"/..");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 &local_e8,filename);
  std::__cxx11::string::~string((string *)&local_e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,(stat *)((long)&path.field_2 + 8));
  if (iVar1 < 0) {
    local_f8 = 1;
  }
  else if (((uint)fileStat.st_nlink & 4) == 0) {
    local_f8 = 1;
  }
  else if (((uint)fileStat.st_nlink & 0xf000) == 0x4000) {
    local_f8 = 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    mmapAddr._4_4_ = open(pcVar2,0);
    file = (char *)mmap((void *)0x0,fileStat.st_rdev,1,2,mmapAddr._4_4_,0);
    close(mmapAddr._4_4_);
    pcVar2 = file;
    if (file == (char *)0xffffffffffffffff) {
      munmap((void *)0xffffffffffffffff,fileStat.st_rdev);
      local_f8 = 1;
    }
    else {
      local_110 = file;
      __end = file + fileStat.st_rdev;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char*,void>(local_130,pcVar2,__end,&local_131);
      this_00 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&HttpConn::cache__abi_cxx11_,filename);
      std::__cxx11::string::operator=((string *)this_00,local_130);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator(&local_131);
      munmap(file,fileStat.st_rdev);
      local_f8 = 0;
    }
  }
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void WebServer::cachePage(const std::string& filename) {
    struct stat fileStat;
    std::string path = HttpConn::root + "/.." + filename; 
    if (stat(path.c_str(), &fileStat) < 0) {
        return;
    }
    if (!(fileStat.st_mode & S_IROTH)) {
        return;
    }
    if (S_ISDIR(fileStat.st_mode)) {
        return;
    }
    int fd = open(path.c_str(), O_RDONLY);
    void* mmapAddr = mmap(0, fileStat.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    ::close(fd);
    if (mmapAddr == (void*)-1) {
        munmap(mmapAddr, fileStat.st_size);
        return;
    }

    char* file = static_cast<char*>(mmapAddr); 
    HttpConn::cache_[filename] = std::string(file, file + fileStat.st_size);
    munmap(mmapAddr, fileStat.st_size);
}